

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

TWords * __thiscall
NJamSpell::TSpellCorrector::GetCandidatesRaw
          (TWords *__return_storage_ptr__,TSpellCorrector *this,TWords *sentence,size_t position)

{
  size_type *psVar1;
  pointer *ppTVar2;
  double dVar3;
  pointer pTVar4;
  pointer pTVar5;
  wchar_t *pwVar6;
  size_t sVar7;
  size_t sVar8;
  TWord origWord;
  pointer pTVar9;
  TSpellCorrector *pTVar10;
  vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *this_00;
  pointer pTVar11;
  pointer pTVar12;
  pointer pTVar13;
  pointer pTVar14;
  TWord *pTVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [8];
  iterator iVar19;
  long *plVar20;
  long lVar21;
  __normal_iterator<NJamSpell::TScoredWord_*,_std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>_>
  __i;
  pointer pTVar22;
  bool bVar23;
  bool bVar24;
  wchar_t wVar25;
  wchar_t wVar26;
  wchar_t wVar27;
  wchar_t wVar28;
  undefined1 auStack_108 [8];
  TWord cand;
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  uniqueCandidates;
  TScoredWord local_b8;
  TSpellCorrector *local_98;
  vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *local_90;
  undefined1 auStack_88 [8];
  TWord w;
  TScoredWord s;
  undefined1 auStack_58 [8];
  vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> scoredCandidates;
  
  pTVar4 = (sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(sentence->
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl
                    .super__Vector_impl_data._M_finish - (long)pTVar4 >> 4) <= position) {
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  pTVar4 = pTVar4 + position;
  pwVar6 = pTVar4->Ptr;
  sVar7 = pTVar4->Len;
  pTVar15 = (TWord *)auStack_88;
  auStack_88._0_4_ = SUB84(pwVar6,0);
  auStack_88._4_4_ = (undefined4)((ulong)pwVar6 >> 0x20);
  w.Ptr._0_4_ = (undefined4)sVar7;
  w.Ptr._4_4_ = (undefined4)(sVar7 >> 0x20);
  Edits2(__return_storage_ptr__,this,pTVar15,true);
  pTVar4 = (__return_storage_ptr__->
           super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar5 = (__return_storage_ptr__->
           super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar4 == pTVar5) {
    Edits((TWords *)&cand.Len,this,(TWord *)auStack_88);
    pTVar14 = (__return_storage_ptr__->
              super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
              super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)cand.Len;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)uniqueCandidates._M_h._M_buckets;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)uniqueCandidates._M_h._M_bucket_count;
    cand.Len = 0;
    uniqueCandidates._M_h._M_buckets = (__buckets_ptr)0x0;
    uniqueCandidates._M_h._M_bucket_count = 0;
    if (pTVar14 != (pointer)0x0) {
      operator_delete(pTVar14);
    }
    if (cand.Len != 0) {
      operator_delete((void *)cand.Len);
    }
  }
  if ((__return_storage_ptr__->
      super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->
      super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    return __return_storage_ptr__;
  }
  psVar1 = &uniqueCandidates._M_h._M_bucket_count;
  cand.Len = (size_t)psVar1;
  local_98 = this;
  local_90 = (vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)__return_storage_ptr__;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&cand.Len,CONCAT44(auStack_88._4_4_,auStack_88._0_4_),
             CONCAT44(auStack_88._4_4_,auStack_88._0_4_) + CONCAT44(w.Ptr._4_4_,w.Ptr._0_4_) * 4);
  _auStack_58 = TLangModel::GetWord(&local_98->LangModel,(wstring *)&cand.Len);
  if ((size_type *)cand.Len != psVar1) {
    operator_delete((void *)cand.Len);
  }
  pTVar10 = local_98;
  bVar23 = auStack_58 == (undefined1  [8])0x0;
  bVar24 = scoredCandidates.
           super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
           _M_impl.super__Vector_impl_data._M_start == (pointer)0x0;
  if (bVar24 || bVar23) {
    iVar19._M_current =
         (__return_storage_ptr__->
         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar19._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_00114e22;
  }
  else {
    auStack_88._0_4_ = auStack_58._0_4_;
    auStack_88._4_4_ = auStack_58._4_4_;
    w.Ptr._0_4_ = auStack_58._8_4_;
    w.Ptr._4_4_ = auStack_58._12_4_;
    iVar19._M_current =
         (__return_storage_ptr__->
         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar19._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      pTVar15 = (TWord *)auStack_58;
LAB_00114e22:
      std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
      _M_realloc_insert<NJamSpell::TWord_const&>
                ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)__return_storage_ptr__
                 ,iVar19,pTVar15);
      goto LAB_00114e2d;
    }
  }
  *(undefined4 *)&(iVar19._M_current)->Ptr = auStack_88._0_4_;
  *(undefined4 *)((long)&(iVar19._M_current)->Ptr + 4) = auStack_88._4_4_;
  *(undefined4 *)&(iVar19._M_current)->Len = w.Ptr._0_4_;
  *(undefined4 *)((long)&(iVar19._M_current)->Len + 4) = w.Ptr._4_4_;
  ppTVar2 = &(__return_storage_ptr__->
             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppTVar2 = *ppTVar2 + 1;
LAB_00114e2d:
  std::
  _Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<NJamSpell::TWord*,std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>>
            ((_Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&cand.Len,
             (__return_storage_ptr__->
             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
             super__Vector_impl_data._M_finish,0,auStack_58,&w.Len,&local_b8);
  origWord.Ptr._4_4_ = auStack_88._4_4_;
  origWord.Ptr._0_4_ = auStack_88._0_4_;
  origWord.Len._0_4_ = w.Ptr._0_4_;
  origWord.Len._4_4_ = w.Ptr._4_4_;
  FilterCandidatesByFrequency
            (pTVar10,(unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                      *)&cand.Len,origWord);
  _auStack_58 = (TWord)ZEXT816(0);
  scoredCandidates.
  super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::reserve
            ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)auStack_58,
             (size_type)uniqueCandidates._M_h._M_before_begin._M_nxt);
  if (uniqueCandidates._M_h._M_bucket_count != 0) {
    plVar20 = (long *)uniqueCandidates._M_h._M_bucket_count;
    do {
      auStack_108 = (undefined1  [8])plVar20[1];
      cand.Ptr = (wchar_t *)plVar20[2];
      w.Len = 0;
      s.Word.Ptr = (wchar_t *)0x0;
      pTVar14 = (sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
          _M_impl.super__Vector_impl_data._M_finish != pTVar14) {
        lVar21 = 0;
        uVar16 = 0;
        do {
          if (position == uVar16) {
            if (s.Word.Ptr == (wchar_t *)0x0) {
              pTVar15 = (TWord *)auStack_108;
LAB_00114f3c:
              std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
              _M_realloc_insert<NJamSpell::TWord_const&>
                        ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)&w.Len,
                         (iterator)s.Word.Ptr,pTVar15);
            }
            else {
              wVar25 = auStack_108._0_4_;
              wVar26 = auStack_108._4_4_;
              wVar27 = (wchar_t)cand.Ptr;
              wVar28 = cand.Ptr._4_4_;
LAB_00114f2a:
              *s.Word.Ptr = wVar25;
              s.Word.Ptr[1] = wVar26;
              s.Word.Ptr[2] = wVar27;
              s.Word.Ptr[3] = wVar28;
              s.Word.Ptr = s.Word.Ptr + 4;
            }
          }
          else if ((uVar16 < position && position <= uVar16 + 2) ||
                  (uVar16 <= position + 2 && position < uVar16)) {
            pTVar15 = (TWord *)((long)&pTVar14->Ptr + lVar21);
            if (s.Word.Ptr == (wchar_t *)0x0) goto LAB_00114f3c;
            wVar25 = *(wchar_t *)&pTVar15->Ptr;
            wVar26 = *(wchar_t *)((long)&pTVar15->Ptr + 4);
            wVar27 = (wchar_t)pTVar15->Len;
            wVar28 = *(wchar_t *)((long)&pTVar15->Len + 4);
            goto LAB_00114f2a;
          }
          uVar16 = uVar16 + 1;
          pTVar14 = (sentence->
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl
                    .super__Vector_impl_data._M_start;
          lVar21 = lVar21 + 0x10;
        } while (uVar16 < (ulong)((long)(sentence->
                                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar14
                                 >> 4));
      }
      pTVar10 = local_98;
      local_b8.Score = 0.0;
      local_b8.Word.Ptr = (wchar_t *)auStack_108;
      local_b8.Word.Len = (size_t)cand.Ptr;
      local_b8.Score = TLangModel::Score(&local_98->LangModel,(TWords *)&w.Len);
      if ((local_b8.Word.Ptr != (wchar_t *)CONCAT44(auStack_88._4_4_,auStack_88._0_4_)) ||
         ((wchar_t *)local_b8.Word.Len != (wchar_t *)CONCAT44(w.Ptr._4_4_,w.Ptr._0_4_))) {
        if (bVar24 || bVar23) {
          local_b8.Score = local_b8.Score - pTVar10->UnknownWordsPenalty;
        }
        else if (pTVar4 == pTVar5) {
          local_b8.Score = local_b8.Score * 50.0;
        }
        else {
          local_b8.Score = local_b8.Score - pTVar10->KnownWordsPenalty;
        }
      }
      if (scoredCandidates.
          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          scoredCandidates.
          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>::
        _M_realloc_insert<NJamSpell::TScoredWord_const&>
                  ((vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>> *)
                   auStack_58,
                   (iterator)
                   scoredCandidates.
                   super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                   ._M_impl.super__Vector_impl_data._M_start,&local_b8);
      }
      else {
        (scoredCandidates.
         super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl
         .super__Vector_impl_data._M_start)->Score = local_b8.Score;
        ((scoredCandidates.
          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
          _M_impl.super__Vector_impl_data._M_start)->Word).Ptr = local_b8.Word.Ptr;
        ((scoredCandidates.
          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
          _M_impl.super__Vector_impl_data._M_start)->Word).Len = local_b8.Word.Len;
        scoredCandidates.
        super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
        super__Vector_impl_data._M_start =
             scoredCandidates.
             super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      if (w.Len != 0) {
        operator_delete((void *)w.Len);
      }
      plVar20 = (long *)*plVar20;
    } while (plVar20 != (long *)0x0);
  }
  auVar18 = auStack_58;
  pTVar11 = scoredCandidates.
            super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (auStack_58 !=
      (undefined1  [8])
      scoredCandidates.
      super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar17 = (long)scoredCandidates.
                   super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58;
    uVar16 = (lVar17 >> 3) * -0x5555555555555555;
    lVar21 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRaw(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
              (auStack_58,
               scoredCandidates.
               super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
               _M_impl.super__Vector_impl_data._M_start,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar17 < 0x181) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRaw(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                (auVar18,pTVar11);
    }
    else {
      pTVar22 = (pointer)((long)auVar18 + 0x180);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRaw(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                (auVar18,pTVar22);
      for (; pTVar22 != pTVar11; pTVar22 = pTVar22 + 1) {
        w.Len = (size_t)(pTVar22->Word).Ptr;
        sVar7 = (pTVar22->Word).Len;
        dVar3 = pTVar22->Score;
        pTVar12 = pTVar22;
        pTVar13 = pTVar22;
        if (pTVar22[-1].Score <= dVar3 && dVar3 != pTVar22[-1].Score) {
          do {
            pTVar12 = pTVar13 + -1;
            pTVar13->Score = pTVar13[-1].Score;
            sVar8 = pTVar13[-1].Word.Len;
            (pTVar13->Word).Ptr = pTVar13[-1].Word.Ptr;
            (pTVar13->Word).Len = sVar8;
            pTVar9 = pTVar13 + -2;
            pTVar13 = pTVar12;
          } while (pTVar9->Score <= dVar3 && dVar3 != pTVar9->Score);
        }
        (pTVar12->Word).Ptr = (wchar_t *)w.Len;
        (pTVar12->Word).Len = sVar7;
        pTVar12->Score = dVar3;
      }
    }
  }
  this_00 = local_90;
  if (*(long *)(local_90 + 8) != *(long *)local_90) {
    *(long *)(local_90 + 8) = *(long *)local_90;
  }
  pTVar11 = scoredCandidates.
            super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (auStack_58 !=
      (undefined1  [8])
      scoredCandidates.
      super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
      super__Vector_impl_data._M_start) {
    auVar18 = auStack_58;
    do {
      w.Len = (size_t)(((pointer)auVar18)->Word).Ptr;
      iVar19._M_current = *(TWord **)(this_00 + 8);
      if (iVar19._M_current == *(TWord **)(this_00 + 0x10)) {
        std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
        _M_realloc_insert<NJamSpell::TWord_const&>(this_00,iVar19,(TWord *)&w.Len);
      }
      else {
        sVar7 = (((pointer)auVar18)->Word).Len;
        (iVar19._M_current)->Ptr = (((pointer)auVar18)->Word).Ptr;
        (iVar19._M_current)->Len = sVar7;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
      }
      auVar18 = (undefined1  [8])((long)auVar18 + 0x18);
    } while (auVar18 != (undefined1  [8])pTVar11);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58);
  }
  std::
  _Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&cand.Len);
  return (TWords *)this_00;
}

Assistant:

TWords TSpellCorrector::GetCandidatesRaw(const TWords& sentence, size_t position) const {
    if (position >= sentence.size()) {
        return TWords();
    }

    TWord w = sentence[position];

    TWords candidates = Edits2(w);

    bool firstLevel = true;
    bool knownWord = false;
    if (candidates.empty()) {
        candidates = Edits(w);
        firstLevel = false;
    }

    if (candidates.empty()) {
        return candidates;
    }

    {
        TWord c = LangModel.GetWord(std::wstring(w.Ptr, w.Len));
        if (c.Ptr && c.Len) {
            w = c;
            candidates.push_back(c);
            knownWord = true;
        } else {
            candidates.push_back(w);
        }
    }

    std::unordered_set<TWord, TWordHashPtr> uniqueCandidates(candidates.begin(), candidates.end());

    FilterCandidatesByFrequency(uniqueCandidates, w);

    std::vector<TScoredWord> scoredCandidates;
    scoredCandidates.reserve(uniqueCandidates.size());

    for (TWord cand: uniqueCandidates) {
        TWords candSentence;
        for (size_t i = 0; i < sentence.size(); ++i) {
            if (i == position) {
                candSentence.push_back(cand);
            } else if ((i < position && i + 2 >= position) ||
                       (i > position && i <= position + 2))
            {
                candSentence.push_back(sentence[i]);
            }
        }

        TScoredWord scored;
        scored.Word = cand;
        scored.Score = LangModel.Score(candSentence);
        if (!(scored.Word == w)) {
            if (knownWord) {
                if (firstLevel) {
                    scored.Score -= KnownWordsPenalty;
                } else {
                    scored.Score *= 50.0;
                }
            } else {
                scored.Score -= UnknownWordsPenalty;
            }
        }
        scoredCandidates.push_back(scored);
    }

    std::sort(scoredCandidates.begin(), scoredCandidates.end(), [](TScoredWord w1, TScoredWord w2) {
        return w1.Score > w2.Score;
    });

    candidates.clear();
    for (auto s: scoredCandidates) {
        candidates.push_back(s.Word);
    }
    return candidates;
}